

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  ImGuiWindowStackData *pIVar1;
  long in_RDI;
  ImGuiPopupPositionPolicy in_stack_00000014;
  ImRect *in_stack_00000018;
  ImRect *in_stack_00000020;
  ImGuiDir *in_stack_00000028;
  ImVec2 *in_stack_00000030;
  ImVec2 *in_stack_00000038;
  ImRect r_avoid_1;
  ImVec2 ref_pos;
  float sc;
  ImRect r_avoid;
  float horizontal_overlap;
  ImGuiWindow *parent_window;
  ImRect r_outer;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffff30;
  float fVar2;
  undefined8 in_stack_ffffffffffffff38;
  float fVar3;
  ImRect *in_stack_ffffffffffffff40;
  ImGuiWindow *in_stack_ffffffffffffff50;
  ImRect local_74;
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 local_54;
  undefined8 local_4c;
  undefined8 local_44;
  undefined8 local_3c;
  float local_34;
  ImGuiWindow *local_30;
  ImRect local_28;
  ImGuiContext *local_18;
  long local_10;
  ImVec2 local_8;
  
  local_18 = GImGui;
  local_10 = in_RDI;
  local_28 = GetPopupAllowedExtentRect(in_stack_ffffffffffffff50);
  if ((*(uint *)(local_10 + 0xc) & 0x10000000) == 0) {
    if ((*(uint *)(local_10 + 0xc) & 0x4000000) == 0) {
      if ((*(uint *)(local_10 + 0xc) & 0x2000000) == 0) {
        local_8 = *(ImVec2 *)(local_10 + 0x18);
      }
      else {
        NavCalcPreferredRefPos();
        ImRect::ImRect(in_stack_ffffffffffffff30);
        fVar2 = (float)((ulong)in_stack_ffffffffffffff30 >> 0x20);
        fVar3 = (float)((ulong)in_stack_ffffffffffffff38 >> 0x20);
        if ((((local_18->NavDisableHighlight & 1U) == 0) &&
            ((local_18->NavDisableMouseHover & 1U) != 0)) &&
           (((local_18->IO).ConfigFlags & 4U) == 0)) {
          ImRect::ImRect(in_stack_ffffffffffffff40,fVar3,(float)in_stack_ffffffffffffff38,fVar2,
                         SUB84(in_stack_ffffffffffffff30,0));
        }
        else {
          ImRect::ImRect(in_stack_ffffffffffffff40,fVar3,(float)in_stack_ffffffffffffff38,fVar2,
                         SUB84(in_stack_ffffffffffffff30,0));
        }
        local_8 = FindBestWindowPosForPopupEx
                            (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020
                             ,in_stack_00000018,in_stack_00000014);
      }
    }
    else {
      ImRect::ImRect(&local_74,(ImVec2 *)(local_10 + 0x18),(ImVec2 *)(local_10 + 0x18));
      local_8 = FindBestWindowPosForPopupEx
                          (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
                           in_stack_00000018,in_stack_00000014);
    }
  }
  else {
    pIVar1 = ImVector<ImGuiWindowStackData>::operator[]
                       (&local_18->CurrentWindowStack,(local_18->CurrentWindowStack).Size + -2);
    local_30 = pIVar1->Window;
    local_34 = (local_18->Style).ItemInnerSpacing.x;
    ImRect::ImRect(in_stack_ffffffffffffff30);
    fVar2 = (float)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    fVar3 = (float)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    if (((local_30->DC).MenuBarAppending & 1U) == 0) {
      ImRect::ImRect(in_stack_ffffffffffffff40,fVar3,(float)in_stack_ffffffffffffff38,fVar2,
                     SUB84(in_stack_ffffffffffffff30,0));
      local_44 = local_64;
      local_3c = local_5c;
    }
    else {
      ImRect::ImRect(in_stack_ffffffffffffff40,fVar3,(float)in_stack_ffffffffffffff38,fVar2,
                     SUB84(in_stack_ffffffffffffff30,0));
      local_44 = local_54;
      local_3c = local_4c;
    }
    local_8 = FindBestWindowPosForPopupEx
                        (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
                         in_stack_00000018,in_stack_00000014);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetPopupAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2].Window;
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, ImRect(window->Pos, window->Pos), ImGuiPopupPositionPolicy_Default); // Ideally we'd disable r_avoid here
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        return FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Tooltip);
    }
    IM_ASSERT(0);
    return window->Pos;
}